

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

void XXH128(void *input,size_t len,unsigned_long_long seed,void *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  XXH_endianess endian_detected;
  void *out_local;
  unsigned_long_long seed_local;
  size_t len_local;
  void *input_local;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  U64 h2_1;
  U64 h1_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  long local_1b8;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  U64 h2;
  U64 h1;
  BYTE *bEnd;
  BYTE *p;
  
  bEnd = (BYTE *)input;
  if (len < 0x20) {
    h2 = seed + 0x27d4eb2f165667c5;
    limit = (BYTE *)(seed + 0x9e3779b185ebca87);
  }
  else {
    v2 = seed + 0x60ea27eeadc0b5d6;
    v3 = seed + 0xc2b2ae3d27d4eb4f;
    local_1b8 = seed + 0x61c8864e7a143579;
    v4 = seed;
    do {
      uVar1 = *(long *)bEnd * -0x3d4d51c2d82b14b1 + v2;
      uVar1 = uVar1 * 0x80000000 | uVar1 >> 0x21;
      v2 = uVar1 * -0x61c8864e7a143579;
      uVar2 = *(long *)(bEnd + 8) * -0x3d4d51c2d82b14b1 + v3;
      uVar3 = uVar2 * 0x80000000 | uVar2 >> 0x21;
      v3 = uVar3 * -0x61c8864e7a143579;
      uVar2 = *(long *)(bEnd + 0x10) * -0x3d4d51c2d82b14b1 + v4;
      uVar2 = uVar2 * 0x80000000 | uVar2 >> 0x21;
      v4 = uVar2 * -0x61c8864e7a143579;
      uVar4 = *(long *)(bEnd + 0x18) * -0x3d4d51c2d82b14b1 + local_1b8;
      bEnd = bEnd + 0x20;
      uVar4 = uVar4 * 0x80000000 | uVar4 >> 0x21;
      local_1b8 = uVar4 * -0x61c8864e7a143579;
    } while (bEnd <= (BYTE *)((long)input + (len - 0x20)));
    uVar1 = uVar1 * -0x784349ab80000000 | uVar1 * -0x210ca4fef0869357 >> 0x21;
    uVar5 = uVar1 * -0x61c8864e7a143579;
    uVar3 = uVar3 * -0x210ca4fef0869357;
    uVar1 = (uVar3 << 0x21 | uVar3 >> 0x1f) * -0x61c8864e7a143579 ^
            ((uVar1 * -0x73d0a1abc8000000 | uVar5 >> 0x25) + uVar5) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar1 = (uVar2 * 0x21ef2d9520000000 | uVar2 * -0x210ca4fef0869357 >> 0x23) * -0x61c8864e7a143579
            ^ ((uVar1 << 0x1b | uVar1 >> 0x25) + uVar1) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
              uVar5;
    limit = (BYTE *)((uVar4 * 0x87bcb6548000000 | uVar4 * -0x210ca4fef0869357 >> 0x25) *
                     -0x61c8864e7a143579 ^
                    ((uVar1 << 0x1b | uVar1 >> 0x25) + uVar1) * -0x61c8864e7a143579 +
                    0x85ebca77c2b2ae63 ^ uVar1);
    h2 = (long)(limit + ((long)limit << 0x1b | (ulong)limit >> 0x25)) * -0x61c8864e7a143579 +
         0x85ebca77c2b2ae63U ^ uVar1;
  }
  switch((uint)len & 0x1f) {
  case 0x1f:
    limit = (BYTE *)((ulong)bEnd[0x1e] << 0x30 ^ (ulong)limit);
  case 0x1e:
    limit = (BYTE *)((ulong)bEnd[0x1d] << 0x28 ^ (ulong)limit);
  case 0x1d:
    limit = (BYTE *)((ulong)bEnd[0x1c] << 0x20 ^ (ulong)limit);
  case 0x1c:
    limit = (BYTE *)((ulong)bEnd[0x1b] << 0x18 ^ (ulong)limit);
  case 0x1b:
    limit = (BYTE *)((ulong)bEnd[0x1a] << 0x10 ^ (ulong)limit);
  case 0x1a:
    limit = (BYTE *)((ulong)bEnd[0x19] << 8 ^ (ulong)limit);
  case 0x19:
    limit = (BYTE *)((ulong)bEnd[0x18] ^ (ulong)limit);
    h2 = ((long)limit * -0x6a8e16c158a58800 | (ulong)((long)limit * -0x3d4d51c2d82b14b1) >> 0x35) *
         -0x61c8864e7a143579 ^ h2;
  case 0x18:
    h2 = (ulong)bEnd[0x17] << 0x38 ^ h2;
  case 0x17:
    h2 = (ulong)bEnd[0x16] << 0x30 ^ h2;
  case 0x16:
    h2 = (ulong)bEnd[0x15] << 0x28 ^ h2;
  case 0x15:
    h2 = (ulong)bEnd[0x14] << 0x20 ^ h2;
  case 0x14:
    h2 = (ulong)bEnd[0x13] << 0x18 ^ h2;
  case 0x13:
    h2 = (ulong)bEnd[0x12] << 0x10 ^ h2;
  case 0x12:
    h2 = (ulong)bEnd[0x11] << 8 ^ h2;
  case 0x11:
    h2 = bEnd[0x10] ^ h2;
    limit = (BYTE *)((h2 * -0x6a8e16c158a58800 | h2 * -0x3d4d51c2d82b14b1 >> 0x35) *
                     -0x61c8864e7a143579 ^ (ulong)limit);
  case 0x10:
    limit = (BYTE *)((ulong)bEnd[0xf] << 0x38 ^ (ulong)limit);
  case 0xf:
    limit = (BYTE *)((ulong)bEnd[0xe] << 0x30 ^ (ulong)limit);
  case 0xe:
    limit = (BYTE *)((ulong)bEnd[0xd] << 0x28 ^ (ulong)limit);
  case 0xd:
    limit = (BYTE *)((ulong)bEnd[0xc] << 0x20 ^ (ulong)limit);
  case 0xc:
    limit = (BYTE *)((ulong)bEnd[0xb] << 0x18 ^ (ulong)limit);
  case 0xb:
    limit = (BYTE *)((ulong)bEnd[10] << 0x10 ^ (ulong)limit);
  case 10:
    limit = (BYTE *)((ulong)bEnd[9] << 8 ^ (ulong)limit);
  case 9:
    limit = (BYTE *)((ulong)bEnd[8] ^ (ulong)limit);
    h2 = ((long)limit * -0x6a8e16c158a58800 | (ulong)((long)limit * -0x3d4d51c2d82b14b1) >> 0x35) *
         -0x61c8864e7a143579 ^ h2;
  case 8:
    h2 = (ulong)bEnd[7] << 0x38 ^ h2;
  case 7:
    h2 = (ulong)bEnd[6] << 0x30 ^ h2;
  case 6:
    h2 = (ulong)bEnd[5] << 0x28 ^ h2;
  case 5:
    h2 = (ulong)bEnd[4] << 0x20 ^ h2;
  case 4:
    h2 = (ulong)bEnd[3] << 0x18 ^ h2;
  case 3:
    h2 = (ulong)bEnd[2] << 0x10 ^ h2;
  case 2:
    h2 = (ulong)bEnd[1] << 8 ^ h2;
  case 1:
    limit = (BYTE *)(((*bEnd ^ h2) * -0x58a6874d4cc1d800 | (*bEnd ^ h2) * 0x27d4eb2f165667c5 >> 0x35
                     ) * -0x61c8864e7a143579 ^ (ulong)limit);
  default:
    uVar1 = len + ((long)limit << 0x1b | (ulong)limit >> 0x25) * -0x61c8864e7a143579 +
                  -0x7a1435883d4d519d;
    uVar2 = (uVar1 >> 0x21 ^ (ulong)(limit + len)) * -0x3d4d51c2d82b14b1;
    uVar1 = (uVar2 >> 0x1d ^ uVar1) * 0x165667b19e3779f9;
    *(ulong *)out = uVar1;
    *(ulong *)((long)out + 8) = uVar1 >> 0x20 ^ uVar2;
    return;
  }
}

Assistant:

void XXH128(const void *input, size_t len, unsigned long long seed, void *out) {
#if 0
    XXH128_state_t state;
    XXH128_reset(&state, seed);
    XXH128_update(&state, input, len);
    XXH128_digest(&state, out);
#else
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

#  if !defined(XXH_USE_UNALIGNED_ACCESS)
    if ((((size_t)input) & 7)==0)   // Input is aligned, let's leverage the speed advantage
    {
        if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
            XXH128_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned, out);
        else
            XXH128_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned, out);
    }
#  endif

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        XXH128_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned, out);
    else
        XXH128_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned, out);
#endif
}